

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<IntVar::PropInfo>::push(vec<IntVar::PropInfo> *this,PropInfo *elem)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  PropInfo *pPVar4;
  ulong uVar5;
  
  uVar1 = this->cap;
  if (this->sz == uVar1) {
    uVar5 = 2;
    if (1 < uVar1) {
      uVar5 = (ulong)(uVar1 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar5;
    pPVar4 = (PropInfo *)realloc(this->data,uVar5 << 4);
    this->data = pPVar4;
  }
  uVar1 = this->sz;
  this->sz = uVar1 + 1;
  iVar2 = elem->pos;
  iVar3 = elem->eflags;
  pPVar4 = this->data + uVar1;
  pPVar4->p = elem->p;
  pPVar4->pos = iVar2;
  pPVar4->eflags = iVar3;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}